

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBufferTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::toTestName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,ModifyBits modifyBits)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  int local_1d8;
  int infoNdx;
  bool first;
  ostringstream stream;
  anon_struct_16_2_44180aad_conflict bitInfos [4];
  ModifyBits modifyBits_local;
  
  bitInfos[3].str._4_4_ = (uint)this;
  memcpy(&stream.field_0x170,&DAT_032cf110,0x40);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&infoNdx);
  bVar1 = true;
  for (local_1d8 = 0; local_1d8 < 4; local_1d8 = local_1d8 + 1) {
    if ((bitInfos[3].str._4_4_ & *(uint *)&bitInfos[(long)local_1d8 + -1].str) != 0) {
      pcVar3 = "_";
      if (bVar1) {
        pcVar3 = "";
      }
      poVar2 = std::operator<<((ostream *)&infoNdx,pcVar3);
      std::operator<<(poVar2,*(char **)(bitInfos + local_1d8));
      bVar1 = false;
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&infoNdx);
  return __return_storage_ptr__;
}

Assistant:

string toTestName (ModifyBits modifyBits)
{
	struct
	{
		ModifyBits	bit;
		const char*	str;
	} bitInfos[] =
	{
		{ MODIFYBITS_BUFFERDATA,			"bufferdata"			},
		{ MODIFYBITS_BUFFERSUBDATA,			"buffersubdata"			},
		{ MODIFYBITS_MAPBUFFER_WRITE,		"mapbuffer_write"		},
		{ MODIFYBITS_MAPBUFFER_READWRITE,	"mapbuffer_readwrite"	}
	};

	std::ostringstream	stream;
	bool				first	= true;

	DE_ASSERT(modifyBits != 0);

	for (int infoNdx = 0; infoNdx < DE_LENGTH_OF_ARRAY(bitInfos); infoNdx++)
	{
		if (modifyBits & bitInfos[infoNdx].bit)
		{
			stream << (first ? "" : "_") << bitInfos[infoNdx].str;
			first = false;
		}
	}

	return stream.str();
}